

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void HU4_C(uint8_t *dst)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  undefined1 auVar5 [16];
  
  bVar1 = dst[0x1f];
  bVar2 = dst[0x3f];
  bVar3 = dst[0x5f];
  *dst = (uint8_t)((uint)bVar1 + (uint)dst[-1] + 1 >> 1);
  uVar4 = (uint8_t)((uint)bVar1 + (uint)bVar2 + 1 >> 1);
  dst[0x20] = uVar4;
  dst[2] = uVar4;
  uVar4 = (uint8_t)((uint)bVar2 + (uint)bVar3 + 1 >> 1);
  dst[0x40] = uVar4;
  dst[0x22] = uVar4;
  dst[1] = (uint8_t)((uint)dst[-1] + (uint)bVar2 + 2 + (uint)bVar1 * 2 >> 2);
  uVar4 = (uint8_t)((uint)bVar1 + (uint)bVar3 + (uint)bVar2 * 2 + 2 >> 2);
  dst[0x21] = uVar4;
  dst[3] = uVar4;
  uVar4 = (uint8_t)((uint)bVar2 + (uint)bVar3 + 2 + (uint)bVar3 * 2 >> 2);
  dst[0x41] = uVar4;
  dst[0x23] = uVar4;
  auVar5 = pshuflw(ZEXT216(CONCAT11(bVar3,bVar3)),ZEXT216(CONCAT11(bVar3,bVar3)),0);
  *(int *)(dst + 0x60) = auVar5._0_4_;
  dst[0x42] = bVar3;
  dst[0x43] = bVar3;
  return;
}

Assistant:

static void HU4_C(uint8_t* dst) {   // Horizontal-Up
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int L = dst[-1 + 3 * BPS];
  DST(0, 0) =             AVG2(I, J);
  DST(2, 0) = DST(0, 1) = AVG2(J, K);
  DST(2, 1) = DST(0, 2) = AVG2(K, L);
  DST(1, 0) =             AVG3(I, J, K);
  DST(3, 0) = DST(1, 1) = AVG3(J, K, L);
  DST(3, 1) = DST(1, 2) = AVG3(K, L, L);
  DST(3, 2) = DST(2, 2) =
    DST(0, 3) = DST(1, 3) = DST(2, 3) = DST(3, 3) = L;
}